

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi_load_gif_from_memory
                    (stbi_uc *buffer,int len,int **delays,int *x,int *y,int *z,int *comp,
                    int req_comp)

{
  int h;
  int bytes_per_pixel;
  uint uVar1;
  int iVar2;
  stbi__context *__src;
  int *piVar3;
  long lVar4;
  uint uVar5;
  int *two_back;
  int iVar6;
  stbi__context *s_00;
  uchar *image;
  stbi__context s;
  uchar *local_89b0;
  stbi__context local_8978;
  stbi__gif local_88a0;
  
  local_8978.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  local_8978.read_from_callbacks = 0;
  local_8978.img_buffer_end = buffer + len;
  two_back = y;
  local_8978.img_buffer = buffer;
  local_8978.img_buffer_original = buffer;
  local_8978.img_buffer_original_end = local_8978.img_buffer_end;
  iVar2 = stbi__gif_test(&local_8978);
  if (iVar2 == 0) {
    stbi__g_failure_reason = "not GIF";
    local_89b0 = (uchar *)0x0;
  }
  else {
    uVar1 = 0;
    memset(&local_88a0,0,0x8870);
    if (delays != (int **)0x0) {
      *delays = (int *)0x0;
    }
    local_89b0 = (uchar *)0x0;
    lVar4 = 0;
    do {
      s_00 = &local_8978;
      __src = (stbi__context *)
              stbi__gif_load_next(s_00,&local_88a0,comp,(int)lVar4,(stbi_uc *)two_back);
      uVar5 = uVar1;
      if (__src != (stbi__context *)0x0 && __src != s_00) {
        *x = local_88a0.w;
        *y = local_88a0.h;
        uVar5 = uVar1 + 1;
        iVar6 = local_88a0.h * local_88a0.w;
        iVar2 = iVar6 * 4;
        if (local_89b0 == (uchar *)0x0) {
          local_89b0 = (uchar *)malloc((long)(int)(iVar2 * uVar5));
          if (delays != (int **)0x0) {
            piVar3 = (int *)malloc((long)(int)uVar5 << 2);
            goto LAB_001c341b;
          }
        }
        else {
          local_89b0 = (uchar *)realloc(local_89b0,(long)(int)(iVar2 * uVar5));
          if (delays != (int **)0x0) {
            piVar3 = (int *)realloc(*delays,(long)(int)uVar5 << 2);
LAB_001c341b:
            *delays = piVar3;
          }
        }
        memcpy(local_89b0 + (int)(iVar2 * uVar1),__src,(long)iVar2);
        if (0 < (int)uVar1) {
          lVar4 = (long)local_89b0 - (long)(iVar6 * 8);
        }
        if (delays != (int **)0x0) {
          (*delays)[uVar1] = local_88a0.delay;
        }
      }
      uVar1 = uVar5;
    } while (__src != (stbi__context *)0x0 && __src != s_00);
    free(local_88a0.out);
    free(local_88a0.history);
    free(local_88a0.background);
    if ((req_comp & 0xfffffffbU) != 0) {
      local_89b0 = stbi__convert_format(local_89b0,4,req_comp,local_88a0.w * uVar1,local_88a0.h);
    }
    *z = uVar1;
  }
  if ((stbi__vertically_flip_on_load != 0) && (iVar2 = *z, 0 < iVar2)) {
    iVar6 = *x;
    h = *y;
    bytes_per_pixel = *comp;
    image = local_89b0;
    do {
      stbi__vertical_flip(image,iVar6,h,bytes_per_pixel);
      image = image + h * iVar6 * bytes_per_pixel;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return local_89b0;
}

Assistant:

STBIDEF stbi_uc *stbi_load_gif_from_memory(stbi_uc const *buffer, int len, int **delays, int *x, int *y, int *z, int *comp, int req_comp)
{
   unsigned char *result;
   stbi__context s; 
   stbi__start_mem(&s,buffer,len); 
   
   result = (unsigned char*) stbi__load_gif_main(&s, delays, x, y, z, comp, req_comp);
   if (stbi__vertically_flip_on_load) {
      stbi__vertical_flip_slices( result, *x, *y, *z, *comp ); 
   }

   return result; 
}